

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnGlobalImport(SharedValidator *this,Location *loc,Type type,bool mutable_)

{
  pointer *ppGVar1;
  iterator __position;
  Result RVar2;
  undefined3 in_register_00000009;
  Enum EVar3;
  GlobalType local_30;
  
  EVar3 = Ok;
  if ((CONCAT31(in_register_00000009,mutable_) != 0) &&
     ((this->options_).features.mutable_globals_enabled_ == false)) {
    RVar2 = PrintError(this,loc,"mutable globals cannot be imported");
    EVar3 = (Enum)(RVar2.enum_ == Error);
  }
  local_30.mutable_ = mutable_;
  __position._M_current =
       (this->globals_).
       super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->globals_).
      super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_30.type = type;
    std::
    vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>::
    _M_realloc_insert<wabt::SharedValidator::GlobalType>(&this->globals_,__position,&local_30);
  }
  else {
    (__position._M_current)->mutable_ = mutable_;
    *(undefined3 *)&(__position._M_current)->field_0x9 = local_30._9_3_;
    (__position._M_current)->type = type;
    ppGVar1 = &(this->globals_).
               super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  this->num_imported_globals_ = this->num_imported_globals_ + 1;
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::OnGlobalImport(const Location& loc,
                                       Type type,
                                       bool mutable_) {
  Result result = Result::Ok;
  if (mutable_ && !options_.features.mutable_globals_enabled()) {
    result |= PrintError(loc, "mutable globals cannot be imported");
  }
  globals_.push_back(GlobalType{type, mutable_});
  ++num_imported_globals_;
  return result;
}